

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cfb.c
# Opt level: O3

err_t beltCFBDecr(void *dest,void *src,size_t count,octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  u32 *key_;
  err_t eVar2;
  belt_cfb_st *st;
  
  eVar2 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(src,count);
    if (bVar1 != 0) {
      bVar1 = memIsValid(key,len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(iv,0x10);
        if (bVar1 != 0) {
          bVar1 = memIsValid(dest,count);
          if (bVar1 != 0) {
            key_ = (u32 *)blobCreate(0x38);
            if (key_ == (u32 *)0x0) {
              eVar2 = 0x6e;
            }
            else {
              beltKeyExpand2(key_,key,len);
              *(undefined8 *)(key_ + 8) = *(undefined8 *)iv;
              *(undefined8 *)(key_ + 10) = *(undefined8 *)(iv + 8);
              key_[0xc] = 0;
              key_[0xd] = 0;
              memMove(dest,src,count);
              beltCFBStepD(dest,count,key_);
              blobClose(key_);
              eVar2 = 0;
            }
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltCFBDecr(void* dest, const void* src, size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltCFB_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// расшифровать
	beltCFBStart(state, key, len, iv);
	memMove(dest, src, count);
	beltCFBStepD(dest, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}